

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

void __thiscall slang::SVInt::shrinkToFit(SVInt *this)

{
  bitwidth_t bits;
  SVInt *in_RDI;
  bitwidth_t minBits;
  SVInt *in_stack_ffffffffffffffe0;
  SVInt *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  SVInt *this_00;
  
  this_00 = in_RDI;
  bits = getMinRepresentedBits(in_stack_ffffffffffffffe8);
  if (bits == 0) {
    bits = 1;
  }
  if (bits != (in_RDI->super_SVIntStorage).bitWidth) {
    resize(this_00,bits);
    operator=(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    ~SVInt((SVInt *)CONCAT44(bits,in_stack_fffffffffffffff0));
  }
  return;
}

Assistant:

void SVInt::shrinkToFit() {
    bitwidth_t minBits = getMinRepresentedBits();
    if (minBits == 0)
        minBits = 1;

    if (minBits != bitWidth)
        *this = resize(minBits);
}